

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlParserCtxtPtr htmlCreateDocParserCtxt(xmlChar *cur,char *encoding)

{
  int size;
  xmlCharEncoding enc_00;
  xmlChar *pxVar1;
  xmlCharEncodingHandlerPtr handler_00;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncoding enc;
  htmlParserCtxtPtr ctxt;
  int len;
  char *encoding_local;
  xmlChar *cur_local;
  
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    size = xmlStrlen(cur);
    cur_local = (xmlChar *)htmlCreateMemoryParserCtxt((char *)cur,size);
    if ((htmlParserCtxtPtr)cur_local == (htmlParserCtxtPtr)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else if (encoding != (char *)0x0) {
      if (((htmlParserCtxtPtr)cur_local)->input->encoding != (xmlChar *)0x0) {
        (*xmlFree)(((htmlParserCtxtPtr)cur_local)->input->encoding);
      }
      pxVar1 = xmlStrdup((xmlChar *)encoding);
      ((htmlParserCtxtPtr)cur_local)->input->encoding = pxVar1;
      enc_00 = xmlParseCharEncoding(encoding);
      if (enc_00 == XML_CHAR_ENCODING_ERROR) {
        handler_00 = xmlFindCharEncodingHandler(encoding);
        if (handler_00 == (xmlCharEncodingHandlerPtr)0x0) {
          htmlParseErr((xmlParserCtxtPtr)cur_local,XML_ERR_UNSUPPORTED_ENCODING,
                       "Unsupported encoding %s\n",(xmlChar *)encoding,(xmlChar *)0x0);
        }
        else {
          xmlSwitchToEncoding((xmlParserCtxtPtr)cur_local,handler_00);
        }
      }
      else {
        xmlSwitchEncoding((xmlParserCtxtPtr)cur_local,enc_00);
        if (((htmlParserCtxtPtr)cur_local)->errNo == 0x20) {
          htmlParseErr((xmlParserCtxtPtr)cur_local,XML_ERR_UNSUPPORTED_ENCODING,
                       "Unsupported encoding %s\n",(xmlChar *)encoding,(xmlChar *)0x0);
        }
      }
    }
  }
  return (htmlParserCtxtPtr)cur_local;
}

Assistant:

static htmlParserCtxtPtr
htmlCreateDocParserCtxt(const xmlChar *cur, const char *encoding) {
    int len;
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
	return(NULL);
    len = xmlStrlen(cur);
    ctxt = htmlCreateMemoryParserCtxt((char *)cur, len);
    if (ctxt == NULL)
	return(NULL);

    if (encoding != NULL) {
	xmlCharEncoding enc;
	xmlCharEncodingHandlerPtr handler;

	if (ctxt->input->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->input->encoding);
	ctxt->input->encoding = xmlStrdup((const xmlChar *) encoding);

	enc = xmlParseCharEncoding(encoding);
	/*
	 * registered set of known encodings
	 */
	if (enc != XML_CHAR_ENCODING_ERROR) {
	    xmlSwitchEncoding(ctxt, enc);
	    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
		htmlParseErr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
		             "Unsupported encoding %s\n",
			     (const xmlChar *) encoding, NULL);
	    }
	} else {
	    /*
	     * fallback for unknown encodings
	     */
	    handler = xmlFindCharEncodingHandler((const char *) encoding);
	    if (handler != NULL) {
		xmlSwitchToEncoding(ctxt, handler);
	    } else {
		htmlParseErr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
		             "Unsupported encoding %s\n",
			     (const xmlChar *) encoding, NULL);
	    }
	}
    }
    return(ctxt);
}